

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void ngai_elem2_patch_(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,
                      Integer g_c,Integer *clo,Integer *chi,int op)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Integer IVar5;
  Integer IVar6;
  Integer IVar7;
  logical lVar8;
  Integer in_RCX;
  Integer *in_RDX;
  Integer *in_RSI;
  Integer in_RDI;
  Integer *in_R8;
  Integer *in_R9;
  Integer in_stack_00000008;
  Integer *in_stack_00000010;
  Integer *in_stack_00000018;
  Integer jtot;
  Integer last;
  Integer offset;
  int lod [7];
  _iterator_hdl hdl_c;
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_a;
  int local_sync_end;
  int local_sync_begin;
  char notrans;
  char *tempname;
  Integer B_created;
  Integer A_created;
  Integer me;
  Integer num_blocks_c;
  Integer num_blocks_b;
  Integer num_blocks_a;
  Integer g_B;
  Integer g_A;
  Integer btotal;
  Integer atotal;
  Integer n1dim;
  Integer idx;
  char *C_ptr;
  char *B_ptr;
  char *A_ptr;
  Integer ldC [7];
  Integer hiC [7];
  Integer loC [7];
  Integer ldB [7];
  Integer hiB [7];
  Integer loB [7];
  Integer ldA [7];
  Integer hiA [7];
  Integer loA [7];
  Integer cdims [7];
  Integer cndim;
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer compatible;
  Integer j;
  Integer i;
  undefined4 in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff2bc;
  Integer in_stack_fffffffffffff2c0;
  void *in_stack_fffffffffffff2c8;
  Integer in_stack_fffffffffffff2d0;
  Integer *in_stack_fffffffffffff2e8;
  char **in_stack_fffffffffffff2f0;
  Integer *in_stack_fffffffffffff2f8;
  Integer *in_stack_fffffffffffff300;
  _iterator_hdl *in_stack_fffffffffffff308;
  _iterator_hdl *in_stack_fffffffffffff378;
  Integer in_stack_fffffffffffff380;
  void *in_stack_fffffffffffff3a8;
  Integer *in_stack_fffffffffffff3b0;
  Integer *in_stack_fffffffffffff3b8;
  Integer *in_stack_fffffffffffff3c0;
  Integer in_stack_fffffffffffff3c8;
  Integer in_stack_fffffffffffff3d0;
  void *in_stack_fffffffffffff3e0;
  void *in_stack_fffffffffffff3e8;
  int in_stack_fffffffffffff3f0;
  Integer in_stack_fffffffffffff448;
  char *in_stack_fffffffffffff450;
  char *in_stack_fffffffffffff4a8;
  Integer in_stack_fffffffffffff4b0;
  Integer *in_stack_fffffffffffff4b8;
  Integer *in_stack_fffffffffffff4c0;
  Integer *in_stack_fffffffffffff4c8;
  Integer in_stack_fffffffffffff4d0;
  char *in_stack_fffffffffffff528;
  Integer *in_stack_fffffffffffff530;
  Integer in_stack_fffffffffffff538;
  Integer *in_stack_fffffffffffff5b8;
  Integer *in_stack_fffffffffffff5c0;
  Integer in_stack_fffffffffffff5c8;
  Integer in_stack_fffffffffffff5d0;
  Integer *in_stack_fffffffffffff690;
  void *in_stack_fffffffffffff698;
  Integer *in_stack_fffffffffffff6a0;
  Integer *in_stack_fffffffffffff6a8;
  Integer in_stack_fffffffffffff6b0;
  Integer local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  Integer local_328 [8];
  Integer local_2e8 [6];
  Integer *in_stack_fffffffffffffd48;
  Integer in_stack_fffffffffffffd50;
  Integer *in_stack_fffffffffffffd58;
  Integer *in_stack_fffffffffffffd60;
  Integer in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  Integer *in_stack_fffffffffffffd80;
  Integer local_268 [8];
  Integer local_228 [16];
  Integer local_1a8 [8];
  Integer local_168 [8];
  long local_128 [7];
  long local_f0;
  long local_e8 [7];
  long local_b0;
  long local_a8 [8];
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  Integer *local_30;
  Integer *local_28;
  Integer local_20;
  Integer *local_18;
  Integer *local_10;
  Integer local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pnga_nodeid();
  iVar3 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  bVar1 = false;
  bVar2 = false;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar4 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
  pnga_inquire(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
               in_stack_fffffffffffff4b8);
  pnga_inquire(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
               in_stack_fffffffffffff4b8);
  pnga_inquire(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
               in_stack_fffffffffffff4b8);
  if ((local_50 != local_58) || (local_50 != local_60)) {
    pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  }
  for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
    if ((local_10[local_38] < 1) || (local_a8[local_38] < local_18[local_38])) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
  }
  for (local_38 = 0; local_38 < local_b0; local_38 = local_38 + 1) {
    if ((local_28[local_38] < 1) || (local_e8[local_38] < local_30[local_38])) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
  }
  for (local_38 = 0; local_38 < local_f0; local_38 = local_38 + 1) {
    if ((in_stack_00000010[local_38] < 1) || (local_128[local_38] < in_stack_00000018[local_38])) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
  }
  local_390 = 1;
  for (local_38 = 0; local_38 < local_f0; local_38 = local_38 + 1) {
    local_390 = ((in_stack_00000018[local_38] - in_stack_00000010[local_38]) + 1) * local_390;
  }
  local_398 = 1;
  for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
    local_398 = ((local_18[local_38] - local_10[local_38]) + 1) * local_398;
  }
  local_3a0 = 1;
  for (local_38 = 0; local_38 < local_b0; local_38 = local_38 + 1) {
    local_3a0 = ((local_30[local_38] - local_28[local_38]) + 1) * local_3a0;
  }
  if ((local_398 != local_390) || (local_3a0 != local_390)) {
    pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  }
  IVar5 = pnga_total_blocks(local_8);
  IVar6 = pnga_total_blocks(local_20);
  IVar7 = pnga_total_blocks(in_stack_00000008);
  if (((IVar5 < 0) && (IVar6 < 0)) && (IVar7 < 0)) {
    pnga_distribution(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                      in_stack_fffffffffffff5b8);
    pnga_distribution(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                      in_stack_fffffffffffff5b8);
    pnga_distribution(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                      in_stack_fffffffffffff5b8);
    lVar8 = pnga_comp_patch(local_68,local_168,local_1a8,local_f0,local_2e8,local_328);
    if ((lVar8 == 0) ||
       (lVar8 = pnga_comp_patch(local_68,local_10,local_18,local_f0,in_stack_00000010,
                                in_stack_00000018), lVar8 == 0)) {
      local_48 = 0;
    }
    else {
      local_48 = 1;
    }
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
             (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    local_3a8 = in_RDI;
    if (local_48 == 0) {
      if (local_20 == in_stack_00000008) {
        lVar8 = pnga_duplicate(in_stack_fffffffffffff538,in_stack_fffffffffffff530,
                               in_stack_fffffffffffff528);
        if (lVar8 == 0) {
          pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        }
        pnga_copy_patch(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                        in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                        in_stack_fffffffffffffd80);
        local_68 = local_f0;
        bVar1 = true;
        pnga_distribution(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                          in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
      }
      else {
        pnga_copy_patch(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                        in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                        in_stack_fffffffffffffd80);
        local_68 = local_f0;
        local_3a8 = in_stack_00000008;
        pnga_distribution(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                          in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
      }
    }
    lVar8 = pnga_comp_patch(local_b0,local_228,local_268,local_f0,local_2e8,local_328);
    if ((lVar8 == 0) ||
       (lVar8 = pnga_comp_patch(local_b0,local_28,local_30,local_f0,in_stack_00000010,
                                in_stack_00000018), lVar8 == 0)) {
      local_48 = 0;
    }
    else {
      local_48 = 1;
    }
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
             (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    if (local_48 == 0) {
      lVar8 = pnga_duplicate(in_stack_fffffffffffff538,in_stack_fffffffffffff530,
                             in_stack_fffffffffffff528);
      if (lVar8 == 0) {
        pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      }
      pnga_copy_patch(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                      in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                      in_stack_fffffffffffffd80);
      local_b0 = local_f0;
      bVar2 = true;
      pnga_distribution(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                        in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
    }
    if (local_b0 < local_68) {
      local_f0 = local_b0;
    }
    if (local_68 < local_b0) {
      local_f0 = local_68;
    }
    lVar8 = pnga_comp_patch(local_68,local_168,local_1a8,local_f0,local_2e8,local_328);
    if (lVar8 == 0) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    lVar8 = pnga_comp_patch(local_b0,local_228,local_268,local_f0,local_2e8,local_328);
    if (lVar8 == 0) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    lVar8 = pnga_patch_intersect(in_stack_00000010,in_stack_00000018,local_2e8,local_328,local_f0);
    if (lVar8 != 0) {
      pnga_access_ptr(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                      in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      pnga_access_ptr(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                      in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      pnga_access_ptr(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                      in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      ngai_do_elem2_oper(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,
                         in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,
                         in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,
                         in_stack_fffffffffffff3e0,in_stack_fffffffffffff3e8,
                         in_stack_fffffffffffff3f0);
      pnga_release(local_3a8,local_2e8,local_328);
      pnga_release(in_RCX,local_2e8,local_328);
      pnga_release_update(in_stack_00000008,local_2e8,local_328);
    }
  }
  else {
    lVar8 = pnga_duplicate(in_stack_fffffffffffff538,in_stack_fffffffffffff530,
                           in_stack_fffffffffffff528);
    if (lVar8 == 0) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    pnga_copy_patch(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                    in_stack_fffffffffffffd80);
    local_68 = local_f0;
    bVar1 = true;
    lVar8 = pnga_duplicate(in_stack_fffffffffffff538,in_stack_fffffffffffff530,
                           in_stack_fffffffffffff528);
    if (lVar8 == 0) {
      pnga_error(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    pnga_copy_patch(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                    in_stack_fffffffffffffd80);
    local_b0 = local_f0;
    bVar2 = true;
    pnga_local_iterator_init(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    pnga_local_iterator_init(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    pnga_local_iterator_init(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    while (iVar4 = pnga_local_iterator_next
                             (in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                              in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,
                              in_stack_fffffffffffff2e8), iVar4 != 0) {
      pnga_local_iterator_next
                (in_stack_fffffffffffff308,in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                 in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
      pnga_local_iterator_next
                (in_stack_fffffffffffff308,in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                 in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
      for (local_40 = 0; local_40 < local_f0; local_40 = local_40 + 1) {
        *(int *)(&stack0xfffffffffffff2e8 + local_40 * 4) = (int)local_2e8[local_40];
      }
      lVar8 = pnga_patch_intersect(in_stack_00000010,in_stack_00000018,local_2e8,local_328,local_f0)
      ;
      if (lVar8 != 0) {
        for (local_40 = 0; local_40 < local_f0 + -1; local_40 = local_40 + 1) {
        }
        in_stack_fffffffffffff2c8 = (void *)(local_60 + -0x3e9);
        switch(in_stack_fffffffffffff2c8) {
        case (void *)0x0:
          break;
        case (void *)0x1:
          break;
        case (void *)0x2:
          break;
        case (void *)0x3:
          break;
        default:
          break;
        case (void *)0x5:
          break;
        case (void *)0x6:
        }
        ngai_do_elem2_oper(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,
                           in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,
                           in_stack_fffffffffffff3e0,in_stack_fffffffffffff3e8,
                           in_stack_fffffffffffff3f0);
      }
      pnga_release(in_RDI,local_2e8,local_328);
      pnga_release(in_RCX,local_2e8,local_328);
      pnga_release_update(in_stack_00000008,local_2e8,local_328);
    }
  }
  if (bVar1) {
    pnga_destroy((Integer)in_stack_fffffffffffff2c8);
  }
  if (bVar2) {
    pnga_destroy((Integer)in_stack_fffffffffffff2c8);
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

static void ngai_elem2_patch_(g_a, alo, ahi, g_b, blo, bhi,
                              g_c, clo, chi, op)
Integer g_a, *alo, *ahi;    /* patch of g_a */
Integer g_b, *blo, *bhi;    /* patch of g_b */
Integer g_c, *clo, *chi;    /* patch of g_c */
int op; /* operation to be perform between g_a and g_b */
{
  Integer i, j;
  Integer compatible;
  Integer atype, btype, ctype;
  Integer andim, adims[MAXDIM], bndim, bdims[MAXDIM], cndim, cdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  char *A_ptr, *B_ptr, *C_ptr;
  Integer idx, n1dim;
  Integer atotal, btotal;
  Integer g_A = g_a, g_B = g_b;
  Integer num_blocks_a, num_blocks_b, num_blocks_c;
  Integer me= pnga_nodeid(), A_created=0, B_created=0;
  char *tempname = "temp", notrans='n';
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();
  pnga_check_handle(g_a, "gai_elem2_patch_");

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  pnga_inquire(g_c, &ctype, &cndim, cdims);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);
  for(i=0; i<cndim; i++)
    if(clo[i] <= 0 || chi[i] > cdims[i])
      pnga_error("g_c indices out of range ", g_c);

  /* check if numbers of elements in patches match each other */
  n1dim = 1; for(i=0; i<cndim; i++) n1dim *= (chi[i] - clo[i] + 1);
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if((atotal != n1dim) || (btotal != n1dim))
    pnga_error("  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);

  if (num_blocks_a < 0 && num_blocks_b < 0 && num_blocks_c < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution(g_A, me, loA, hiA);
    pnga_distribution(g_B, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC) &&
        pnga_comp_patch(andim, alo, ahi, cndim, clo, chi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - do C<= A
       */
      if(g_b != g_c) {
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
        andim = cndim;
        g_A = g_c;
        pnga_distribution(g_A, me, loA, hiA);
      }
      else {
        if (!pnga_duplicate(g_c, &g_A, tempname))
          pnga_error("ga_dadd_patch: dup failed", 0L);
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
        andim = cndim;
        A_created = 1;
        pnga_distribution(g_A, me, loA, hiA);
      }
    }

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC) &&
        pnga_comp_patch(bndim, blo, bhi, cndim, clo, chi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      pnga_distribution(g_B, me, loB, hiB);
    }        

    if(andim > bndim) cndim = bndim;
    if(andim < bndim) cndim = andim;

    if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
      pnga_error(" A patch mismatch ", g_A); 
    if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
      pnga_error(" B patch mismatch ", g_B);

    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
      pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
      pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
      pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

      /* compute "local" operation accoording to op */
      ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

      /* release access to the data */
      pnga_release       (g_A, loC, hiC);
      pnga_release       (g_B, loC, hiC); 
      pnga_release_update(g_c, loC, hiC); 

    }
  } else {
    _iterator_hdl hdl_a, hdl_b, hdl_c;
    int lod[MAXDIM];
    /* create copies of arrays A and B that are identically distributed
       as C*/
    if (!pnga_duplicate(g_c, &g_A, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
    andim = cndim;
    A_created = 1;

    if (!pnga_duplicate(g_c, &g_B, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
    bndim = cndim;
    B_created = 1;

    /* C is normally distributed so just add copies together for regular
       arrays */
#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_c, &hdl_c);
    while (pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC)) {
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);

      /* make temporary copies of loC and hiC since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<cndim; j++) {
        lod[j] = loC[j];
      }
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
        Integer offset, last, jtot;
        /* evaluate offsets for system */
        offset = 0;
        last = cndim - 1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loC[j] - lod[j])*jtot;
          jtot *= ldC[j];
        }
        offset += (loC[last]-lod[last])*jtot;
        switch(ctype) {
          case C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            C_ptr = (void*)((double*)(C_ptr) + offset);
            break;
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            C_ptr = (void*)((int*)(C_ptr) + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            C_ptr = (void*)((float*)(C_ptr) + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            C_ptr = (void*)((long*)(C_ptr) + offset);
            break;
          default:
            break;
        }
        ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC,
            A_ptr, B_ptr, C_ptr, op);
      }
      /* release access to the data */
      pnga_release       (g_A, loC, hiC);
      pnga_release       (g_B, loC, hiC);
      pnga_release_update(g_c, loC, hiC);
    }
#else
    if (num_blocks_c < 0) {
      pnga_distribution(g_c, me, loC, hiC);
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        /* compute "local" operation accoording to op */
        ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC);
        pnga_release_update(g_c, loC, hiC);
      }
    } else {
      Integer lod[MAXDIM];
      /* Integer hid[MAXDIM]; */
      /* Integer chk; */
      Integer offset, last, jtot;
      if (!pnga_uses_proc_grid(g_c)) {
        Integer nproc = pnga_nnodes();
        for (idx = me; idx < num_blocks_c; idx += nproc) {

          pnga_distribution(g_c, idx, loC, hiC);
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /* hid[j] = hiC[j]; */
          }

          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_c, idx, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;
            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              default:
                break;
            }

            /* compute "local" operation accoording to op */
            ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

            /* release access to the data */
            pnga_release_block       (g_A, idx);
            pnga_release_block       (g_B, idx);
            pnga_release_update_block(g_c, idx);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_c, me, proc_index);
        pnga_get_proc_index(g_c, me, index);
        pnga_get_block_info(g_c, blocks, block_dims);
        pnga_get_proc_grid(g_c, topology);
        while (index[cndim-1] < blocks[cndim-1]) {
          /* find bounding coordinates of block */
          /* chk = 1; */
          for (i = 0; i < cndim; i++) {
            loC[i] = index[i]*block_dims[i]+1;
            hiC[i] = (index[i] + 1)*block_dims[i];
            if (hiC[i] > cdims[i]) hiC[i] = cdims[i];
            /* if (hiC[i] < loC[i]) chk = 0; */
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /* hid[j] = hiC[j]; */
          }

          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_c, index, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;
            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              default:
                break;
            }

            /* compute "local" operation accoording to op */
            ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

            /* release access to the data */
            pnga_release_block_grid       (g_A, index);
            pnga_release_block_grid       (g_B, index);
            pnga_release_update_block_grid(g_c, index);
          }
          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < cndim; i++) {
            if (index[i] >= blocks[i] && i<cndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  if(A_created) pnga_destroy(g_A);
  if(B_created) pnga_destroy(g_B);

  if(local_sync_end)pnga_sync();
}